

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::CartesianProductGenerator<const_trust_token_method_st_*,_bool>::
IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_>::IteratorImpl
          (IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_> *this,
          ParamGeneratorInterface<std::tuple<const_trust_token_method_st_*,_bool>_> *base,
          tuple<testing::internal::ParamGenerator<const_trust_token_method_st_*>,_testing::internal::ParamGenerator<bool>_>
          *generators,bool is_end)

{
  tuple<testing::internal::ParamIterator<const_trust_token_method_st_*>,_testing::internal::ParamIterator<bool>_>
  *local_80;
  undefined1 local_58 [16];
  ParamGenerator<bool> local_48;
  ParamGenerator<const_trust_token_method_st_*> local_30;
  tuple<testing::internal::ParamGenerator<const_trust_token_method_st_*>,_testing::internal::ParamGenerator<bool>_>
  *ptStack_20;
  bool is_end_local;
  tuple<testing::internal::ParamGenerator<const_trust_token_method_st_*>,_testing::internal::ParamGenerator<bool>_>
  *generators_local;
  ParamGeneratorInterface<std::tuple<const_trust_token_method_st_*,_bool>_> *base_local;
  IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_> *this_local;
  
  local_30.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<const_trust_token_method_st_*>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._7_1_ = is_end;
  ptStack_20 = generators;
  generators_local =
       (tuple<testing::internal::ParamGenerator<const_trust_token_method_st_*>,_testing::internal::ParamGenerator<bool>_>
        *)base;
  base_local = (ParamGeneratorInterface<std::tuple<const_trust_token_method_st_*,_bool>_> *)this;
  ParamIteratorInterface<std::tuple<const_trust_token_method_st_*,_bool>_>::ParamIteratorInterface
            (&this->super_ParamIteratorInterface<std::tuple<const_trust_token_method_st_*,_bool>_>);
  (this->super_ParamIteratorInterface<std::tuple<const_trust_token_method_st_*,_bool>_>).
  _vptr_ParamIteratorInterface = (_func_int **)&PTR__IteratorImpl_00aafb30;
  this->base_ = (ParamGeneratorInterface<std::tuple<const_trust_token_method_st_*,_bool>_> *)
                generators_local;
  std::
  get<0ul,testing::internal::ParamGenerator<trust_token_method_st_const*>,testing::internal::ParamGenerator<bool>>
            (ptStack_20);
  ParamGenerator<const_trust_token_method_st_*>::begin(&local_30);
  std::
  get<1ul,testing::internal::ParamGenerator<trust_token_method_st_const*>,testing::internal::ParamGenerator<bool>>
            (ptStack_20);
  ParamGenerator<bool>::begin(&local_48);
  std::
  tuple<testing::internal::ParamIterator<const_trust_token_method_st_*>,_testing::internal::ParamIterator<bool>_>
  ::
  tuple<testing::internal::ParamIterator<const_trust_token_method_st_*>,_testing::internal::ParamIterator<bool>,_true>
            (&this->begin_,(ParamIterator<const_trust_token_method_st_*> *)&local_30,
             (ParamIterator<bool> *)&local_48);
  ParamIterator<bool>::~ParamIterator((ParamIterator<bool> *)&local_48);
  ParamIterator<const_trust_token_method_st_*>::~ParamIterator
            ((ParamIterator<const_trust_token_method_st_*> *)&local_30);
  std::
  get<0ul,testing::internal::ParamGenerator<trust_token_method_st_const*>,testing::internal::ParamGenerator<bool>>
            (ptStack_20);
  ParamGenerator<const_trust_token_method_st_*>::end
            ((ParamGenerator<const_trust_token_method_st_*> *)(local_58 + 8));
  std::
  get<1ul,testing::internal::ParamGenerator<trust_token_method_st_const*>,testing::internal::ParamGenerator<bool>>
            (ptStack_20);
  ParamGenerator<bool>::end((ParamGenerator<bool> *)local_58);
  std::
  tuple<testing::internal::ParamIterator<const_trust_token_method_st_*>,_testing::internal::ParamIterator<bool>_>
  ::
  tuple<testing::internal::ParamIterator<const_trust_token_method_st_*>,_testing::internal::ParamIterator<bool>,_true>
            (&this->end_,(ParamIterator<const_trust_token_method_st_*> *)(local_58 + 8),
             (ParamIterator<bool> *)local_58);
  ParamIterator<bool>::~ParamIterator((ParamIterator<bool> *)local_58);
  ParamIterator<const_trust_token_method_st_*>::~ParamIterator
            ((ParamIterator<const_trust_token_method_st_*> *)(local_58 + 8));
  if ((local_30.impl_.
       super___shared_ptr<const_testing::internal::ParamGeneratorInterface<const_trust_token_method_st_*>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi._7_1_ & 1) == 0) {
    local_80 = &this->begin_;
  }
  else {
    local_80 = &this->end_;
  }
  std::
  tuple<testing::internal::ParamIterator<const_trust_token_method_st_*>,_testing::internal::ParamIterator<bool>_>
  ::tuple(&this->current_,local_80);
  std::shared_ptr<std::tuple<const_trust_token_method_st_*,_bool>_>::shared_ptr
            (&this->current_value_);
  ComputeCurrentValue(this);
  return;
}

Assistant:

IteratorImpl(const ParamGeneratorInterface<ParamType>* base,
                 const std::tuple<ParamGenerator<T>...>& generators,
                 bool is_end)
        : base_(base),
          begin_(std::get<I>(generators).begin()...),
          end_(std::get<I>(generators).end()...),
          current_(is_end ? end_ : begin_) {
      ComputeCurrentValue();
    }